

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

int lyp_yin_parse_complex_ext
              (lys_module *mod,lys_ext_instance_complex *ext,lyxml_elem *yin,unres_schema *unres)

{
  char cVar1;
  lyxml_elem *plVar2;
  lyxml_ns *plVar3;
  int iVar4;
  int iVar5;
  LY_ERR *pLVar6;
  lys_tpdf *tpdf;
  lys_iffeature *iffeat;
  undefined4 *puVar7;
  ushort **ppuVar8;
  lys_when *plVar9;
  lys_revision *rev;
  lys_unique *unique;
  lys_node **pplVar10;
  lys_module *plVar11;
  void **ppvVar12;
  lys_restr *must;
  long *plVar13;
  char *pcVar14;
  void *pvVar15;
  size_t sVar16;
  ushort uVar17;
  LY_STMT LVar18;
  LYS_NODE type;
  lys_node *ext_00;
  LY_ECODE LVar19;
  ly_ctx *plVar20;
  LYEXT_SUBSTMT type_00;
  ushort *puVar21;
  char *pcVar22;
  ushort *puVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  lyxml_elem *elem;
  lyxml_elem *node;
  uint16_t mask;
  uint16_t val1;
  uint16_t val2;
  ushort *local_80;
  char *local_78;
  char *endptr;
  lyext_substmt *local_68;
  lyext_substmt *info;
  undefined8 local_58;
  ushort *local_50;
  unres_schema *local_48;
  lys_node *local_40;
  undefined8 local_38;
  
  node = yin->child;
  local_48 = unres;
  local_40 = (lys_node *)ext;
  do {
    while( true ) {
      ext_00 = local_40;
      if (node == (lyxml_elem *)0x0) {
        if ((local_40->parent != (lys_node *)0x0) &&
           (iVar4 = lyp_mand_check_ext((lys_ext_instance_complex *)local_40,yin->name), iVar4 != 0))
        {
          return 1;
        }
        return 0;
      }
      plVar2 = node->next;
      plVar3 = node->ns;
      if (plVar3 != (lyxml_ns *)0x0) break;
LAB_00131694:
      lyxml_free(mod->ctx,node);
      node = plVar2;
    }
    if (((plVar3 == yin->ns) && ((local_40->flags & 1) != 0)) &&
       (puVar21 = (ushort *)node->name, puVar21 == (ushort *)((lys_ext *)local_40->name)->argument))
    {
      if (local_40->ref == (char *)0x0) {
        local_40->ref = node->content;
        node->content = (char *)0x0;
        goto LAB_00131694;
      }
      plVar20 = mod->ctx;
LAB_00132e41:
      pcVar14 = yin->name;
      LVar19 = LYE_TOOMANY;
LAB_00132e4e:
      ly_vlog(plVar20,LVar19,LY_VLOG_NONE,(void *)0x0,puVar21,pcVar14);
      return 1;
    }
    iVar4 = strcmp(plVar3->value,"urn:ietf:params:xml:ns:yang:yin:1");
    if (iVar4 != 0) {
      iVar4 = lyp_yin_parse_subnode_ext
                        (mod,ext_00,LYEXT_PAR_EXTINST,node,LYEXT_SUBSTMT_SELF,'\0',local_48);
LAB_0013112d:
      if (iVar4 != 0) {
        return 1;
      }
      goto LAB_00131694;
    }
    pcVar14 = node->name;
    iVar4 = strcmp(pcVar14,"description");
    if (iVar4 == 0) {
      LVar18 = LY_STMT_DESCRIPTION;
LAB_0013165e:
      iVar4 = 1;
      pcVar14 = "text";
LAB_0013166b:
      iVar4 = yin_parse_extcomplex_str
                        (mod,node,(lys_ext_instance_complex *)ext_00,LVar18,iVar4,pcVar14,local_48);
LAB_00131670:
      if (iVar4 != 0) {
        return 1;
      }
      goto LAB_00131694;
    }
    iVar4 = strcmp(pcVar14,"reference");
    if (iVar4 == 0) {
      LVar18 = LY_STMT_REFERENCE;
      goto LAB_0013165e;
    }
    iVar4 = strcmp(pcVar14,"units");
    if (iVar4 == 0) {
      LVar18 = LY_STMT_UNITS;
LAB_001316ba:
      pcVar14 = "name";
      goto LAB_001316c4;
    }
    iVar4 = strcmp(pcVar14,"type");
    if (iVar4 != 0) {
      iVar4 = strcmp(pcVar14,"typedef");
      if (iVar4 != 0) {
        iVar4 = strcmp(pcVar14,"if-feature");
        if (iVar4 == 0) {
          ppvVar12 = yin_getplace_for_extcomplex_struct
                               (node,(lys_ext_instance_complex *)ext_00,LY_STMT_IFFEATURE);
          if (ppvVar12 == (void **)0x0) {
            return 1;
          }
          iffeat = (lys_iffeature *)calloc(1,0x20);
          *ppvVar12 = iffeat;
          if (iffeat == (lys_iffeature *)0x0) goto LAB_00132e6d;
          iVar4 = fill_yin_iffeature(local_40,0,node,iffeat,local_48);
          goto LAB_00131670;
        }
        iVar4 = strcmp(pcVar14,"status");
        if (iVar4 == 0) {
          local_38 = (ushort *)
                     yin_getplace_for_extcomplex_flags
                               (node,(lys_ext_instance_complex *)ext_00,LY_STMT_STATUS,0x38);
          if (local_38 == (ushort *)0x0) {
            return 1;
          }
          pcVar14 = lyxml_get_attr(node,"value",(char *)0x0);
          if ((ushort *)pcVar14 == (ushort *)0x0) {
            plVar20 = mod->ctx;
            pcVar22 = node->name;
LAB_00132ea2:
            pcVar14 = "value";
            LVar19 = LYE_MISSARG;
LAB_00132ec7:
            ly_vlog(plVar20,LVar19,LY_VLOG_NONE,(void *)0x0,pcVar14,pcVar22);
            return 1;
          }
          iVar4 = strcmp(pcVar14,"current");
          if (iVar4 == 0) {
            uVar17 = 8;
          }
          else {
            iVar4 = strcmp(pcVar14,"deprecated");
            if (iVar4 == 0) {
              uVar17 = 0x10;
            }
            else {
              iVar4 = strcmp(pcVar14,"obsolete");
              uVar17 = 0x20;
              if (iVar4 != 0) {
                plVar20 = mod->ctx;
                pcVar22 = node->name;
                LVar19 = LYE_INARG;
                goto LAB_00132ec7;
              }
            }
          }
          *local_38 = *local_38 | uVar17;
          iVar4 = lyp_yin_parse_subnode_ext
                            (mod,local_40,LYEXT_PAR_EXTINST,node,LYEXT_SUBSTMT_STATUS,'\0',local_48)
          ;
          goto LAB_00131670;
        }
        iVar4 = strcmp(pcVar14,"config");
        if (iVar4 == 0) {
          val2 = 6;
          val1 = 5;
          mask = 3;
LAB_001318af:
          LVar18 = LY_STMT_MANDATORY;
          pcVar14 = "true";
          pcVar22 = "false";
LAB_001318cb:
          iVar4 = yin_parse_extcomplex_flag
                            (mod,node,(lys_ext_instance_complex *)ext_00,LVar18,pcVar14,pcVar22,mask
                             ,val1,val2,local_48);
          goto LAB_0013112d;
        }
        iVar4 = strcmp(pcVar14,"argument");
        if (iVar4 != 0) {
          iVar4 = strcmp(pcVar14,"default");
          if (iVar4 == 0) {
            LVar18 = LY_STMT_DEFAULT;
LAB_00131a54:
            pcVar14 = "value";
LAB_001316c4:
            iVar4 = yin_parse_extcomplex_str
                              (mod,node,(lys_ext_instance_complex *)ext_00,LVar18,0,pcVar14,local_48
                              );
            goto LAB_0013112d;
          }
          iVar4 = strcmp(pcVar14,"mandatory");
          if (iVar4 == 0) {
            val2 = 0x80;
            val1 = 0x40;
            mask = 0xc0;
            goto LAB_001318af;
          }
          iVar4 = strcmp(pcVar14,"error-app-tag");
          if (iVar4 == 0) {
            LVar18 = LY_STMT_ERRTAG;
            goto LAB_00131a54;
          }
          iVar4 = strcmp(pcVar14,"error-message");
          if (iVar4 == 0) {
            LVar18 = LY_STMT_ERRMSG;
            iVar4 = 1;
            pcVar14 = "value";
            goto LAB_0013166b;
          }
          iVar4 = strcmp(pcVar14,"prefix");
          if (iVar4 == 0) {
            LVar18 = LY_STMT_PREFIX;
            goto LAB_00131a54;
          }
          iVar4 = strcmp(pcVar14,"namespace");
          if (iVar4 == 0) {
            LVar18 = LY_STMT_NAMESPACE;
            pcVar14 = "uri";
            goto LAB_001316c4;
          }
          iVar4 = strcmp(pcVar14,"presence");
          if (iVar4 == 0) {
            LVar18 = LY_STMT_PRESENCE;
            goto LAB_00131a54;
          }
          iVar4 = strcmp(pcVar14,"revision-date");
          if (iVar4 == 0) {
            LVar18 = LY_STMT_REVISIONDATE;
            pcVar14 = "date";
            goto LAB_001316c4;
          }
          iVar4 = strcmp(pcVar14,"key");
          if (iVar4 == 0) {
            LVar18 = LY_STMT_KEY;
            goto LAB_00131a54;
          }
          iVar4 = strcmp(pcVar14,"base");
          if (iVar4 == 0) {
            LVar18 = LY_STMT_BASE;
            goto LAB_001316ba;
          }
          iVar4 = strcmp(pcVar14,"ordered-by");
          if (iVar4 == 0) {
            val1 = 0x100;
            mask = 0x100;
            val2 = 0;
            LVar18 = LY_STMT_ORDEREDBY;
            pcVar14 = "user";
            pcVar22 = "system";
            goto LAB_001318cb;
          }
          iVar4 = strcmp(pcVar14,"belongs-to");
          if (iVar4 == 0) {
            LVar18 = LY_STMT_BELONGSTO;
            pcVar14 = "module";
            goto LAB_001316c4;
          }
          iVar4 = strcmp(pcVar14,"contact");
          if (iVar4 == 0) {
            LVar18 = LY_STMT_CONTACT;
          }
          else {
            iVar4 = strcmp(pcVar14,"organization");
            if (iVar4 != 0) {
              iVar4 = strcmp(pcVar14,"path");
              if (iVar4 == 0) {
                LVar18 = LY_STMT_PATH;
                ext_00 = local_40;
                goto LAB_00131a54;
              }
              iVar4 = strcmp(pcVar14,"require-instance");
              if (iVar4 == 0) {
                LVar18 = LY_STMT_REQINSTANCE;
                pcVar14 = "true";
                pcVar22 = "false";
              }
              else {
                iVar4 = strcmp(pcVar14,"modifier");
                if (iVar4 != 0) {
                  iVar4 = strcmp(pcVar14,"fraction-digits");
                  if (iVar4 == 0) {
                    local_38 = (ushort *)
                               lys_ext_complex_get_substmt
                                         (LY_STMT_DIGITS,(lys_ext_instance_complex *)local_40,
                                          &local_68);
                    if (local_38 == (ushort *)0x0) goto LAB_00132ee9;
                    if ((LY_STMT_CARD_MAND < local_68->cardinality) || ((char)*local_38 == '\0')) {
                      if (local_68->cardinality < LY_STMT_CARD_SOME) {
                        local_50 = (ushort *)0x0;
                        uVar25 = 0;
                      }
                      else {
                        pcVar14 = *(char **)local_38;
                        if (pcVar14 == (char *)0x0) {
                          pvVar15 = malloc(2);
                          *(void **)local_38 = pvVar15;
                          uVar25 = 0;
                          if (pvVar15 == (void *)0x0) goto LAB_00132ed0;
                        }
                        else {
                          uVar25 = 0xffffffff;
                          do {
                            uVar25 = uVar25 + 1;
                            cVar1 = *pcVar14;
                            pcVar14 = pcVar14 + 1;
                          } while (cVar1 != '\0');
                        }
                        local_50 = local_38;
                        local_38 = (ushort *)((ulong)uVar25 + *(long *)local_38);
                      }
                      local_58 = (ushort *)lyxml_get_attr(node,"value",(char *)0x0);
                      if (local_58 != (ushort *)0x0) {
                        lVar26 = strtol((char *)local_58,(char **)0x0,10);
                        if (lVar26 - 0x13U < 0xffffffffffffffee) {
                          plVar20 = mod->ctx;
                          pcVar14 = node->name;
                          LVar19 = LYE_INARG;
                          puVar21 = local_58;
                          goto LAB_00132e4e;
                        }
                        iVar4 = lyp_yin_parse_subnode_ext
                                          (mod,local_40,LYEXT_PAR_EXTINST,node,LYEXT_SUBSTMT_STATUS,
                                           (uint8_t)uVar25,local_48);
                        if (iVar4 != 0) {
                          return 1;
                        }
                        *(char *)local_38 = (char)lVar26;
                        if (local_50 != (ushort *)0x0) {
                          pvVar15 = realloc(*(void **)local_50,(long)(int)uVar25 * 8 + 0x10);
                          if (pvVar15 == (void *)0x0) goto LAB_00132ed0;
                          *(void **)local_50 = pvVar15;
                          *(undefined1 *)((long)pvVar15 + (long)(int)uVar25 + 1) = 0;
                        }
                        goto LAB_00131694;
                      }
LAB_00132f02:
                      plVar20 = mod->ctx;
LAB_00132f05:
                      pcVar14 = node->name;
                      puVar21 = (ushort *)0x1bb5e0;
                      LVar19 = LYE_MISSARG;
                      goto LAB_00132e4e;
                    }
                  }
                  else {
                    iVar4 = strcmp(pcVar14,"max-elements");
                    if (iVar4 == 0) {
                      local_38 = (ushort *)
                                 lys_ext_complex_get_substmt
                                           (LY_STMT_MAX,(lys_ext_instance_complex *)local_40,
                                            &local_68);
                      if (local_38 == (ushort *)0x0) goto LAB_00132ee9;
                      if ((LY_STMT_CARD_MAND < local_68->cardinality) || (*(long *)local_38 == 0)) {
                        if (local_68->cardinality < LY_STMT_CARD_SOME) {
                          local_50 = (ushort *)0x0;
                          uVar25 = 0;
                        }
                        else {
                          plVar13 = *(long **)local_38;
                          if (plVar13 == (long *)0x0) {
                            pvVar15 = malloc(0x10);
                            *(void **)local_38 = pvVar15;
                            uVar25 = 0;
                            if (pvVar15 == (void *)0x0) goto LAB_00132ed0;
                          }
                          else {
                            uVar25 = 0xffffffff;
                            do {
                              uVar25 = uVar25 + 1;
                              lVar26 = *plVar13;
                              plVar13 = plVar13 + 1;
                            } while (lVar26 != 0);
                          }
                          local_50 = local_38;
                          local_38 = (ushort *)((ulong)uVar25 * 8 + *(long *)local_38);
                        }
                        pcVar14 = lyxml_get_attr(node,"value",(char *)0x0);
                        if (pcVar14 != (char *)0x0) {
                          ppuVar8 = __ctype_b_loc();
                          puVar21 = (ushort *)(pcVar14 + -1);
                          do {
                            pcVar14 = (char *)((long)puVar21 + 1);
                            puVar21 = (ushort *)((long)puVar21 + 1);
                          } while ((*(byte *)((long)*ppuVar8 + (long)*pcVar14 * 2 + 1) & 0x20) != 0)
                          ;
                          iVar4 = strcmp((char *)puVar21,"unbounded");
                          if (iVar4 == 0) {
                            local_58 = (ushort *)0x0;
                          }
                          else {
                            endptr = (char *)__errno_location();
                            *(int *)endptr = 0;
                            local_78 = (char *)0x0;
                            local_58 = (ushort *)strtoul((char *)puVar21,&local_78,10);
                            if (((*local_78 != '\0') || (*(char *)puVar21 == '-')) ||
                               ((*(int *)endptr != 0 ||
                                (local_58 + -0x80000000 < (ushort *)0xffffffff00000001))))
                            goto LAB_00132f1a;
                          }
LAB_001320e3:
                          type_00 = LYEXT_SUBSTMT_MAX;
LAB_00132104:
                          iVar4 = lyp_yin_parse_subnode_ext
                                            (mod,local_40,LYEXT_PAR_EXTINST,node,type_00,
                                             (uint8_t)uVar25,local_48);
                          if (iVar4 != 0) {
                            return 1;
                          }
                          puVar7 = (undefined4 *)malloc(4);
                          *(undefined4 **)local_38 = puVar7;
                          if (puVar7 == (undefined4 *)0x0) goto LAB_00132ed0;
                          *puVar7 = (int)local_58;
                          if (local_50 == (ushort *)0x0) goto LAB_00131694;
                          pvVar15 = *(void **)local_50;
                          lVar26 = (long)(int)uVar25;
LAB_00132146:
                          pvVar15 = realloc(pvVar15,lVar26 * 8 + 0x10);
                          local_80 = local_50;
joined_r0x00132156:
                          if (pvVar15 != (void *)0x0) {
LAB_00132160:
                            *(void **)local_80 = pvVar15;
                            *(undefined8 *)((long)pvVar15 + lVar26 * 8 + 8) = 0;
                            goto LAB_00131694;
                          }
                          goto LAB_00132ed0;
                        }
                        goto LAB_00132f02;
                      }
                    }
                    else {
                      iVar4 = strcmp(pcVar14,"min-elements");
                      if (iVar4 == 0) {
                        local_38 = (ushort *)
                                   lys_ext_complex_get_substmt
                                             (LY_STMT_MIN,(lys_ext_instance_complex *)local_40,
                                              &local_68);
                        if (local_38 == (ushort *)0x0) goto LAB_00132ee9;
                        if ((LY_STMT_CARD_MAND < local_68->cardinality) || (*(long *)local_38 == 0))
                        {
                          if (local_68->cardinality < LY_STMT_CARD_SOME) {
                            local_50 = (ushort *)0x0;
                            uVar25 = 0;
                          }
                          else {
                            plVar13 = *(long **)local_38;
                            if (plVar13 == (long *)0x0) {
                              pvVar15 = malloc(0x10);
                              *(void **)local_38 = pvVar15;
                              uVar25 = 0;
                              if (pvVar15 == (void *)0x0) goto LAB_00132ed0;
                            }
                            else {
                              uVar25 = 0xffffffff;
                              do {
                                uVar25 = uVar25 + 1;
                                lVar26 = *plVar13;
                                plVar13 = plVar13 + 1;
                              } while (lVar26 != 0);
                            }
                            local_50 = local_38;
                            local_38 = (ushort *)((ulong)uVar25 * 8 + *(long *)local_38);
                          }
                          pcVar14 = lyxml_get_attr(node,"value",(char *)0x0);
                          if (pcVar14 != (char *)0x0) {
                            ppuVar8 = __ctype_b_loc();
                            puVar21 = (ushort *)(pcVar14 + -1);
                            do {
                              pcVar14 = (char *)((long)puVar21 + 1);
                              puVar21 = (ushort *)((long)puVar21 + 1);
                            } while ((*(byte *)((long)*ppuVar8 + (long)*pcVar14 * 2 + 1) & 0x20) !=
                                     0);
                            endptr = (char *)__errno_location();
                            *(int *)endptr = 0;
                            local_78 = (char *)0x0;
                            local_58 = (ushort *)strtoul((char *)puVar21,&local_78,10);
                            if ((((*local_78 != '\0') || (*(char *)puVar21 == '-')) ||
                                (*(int *)endptr != 0)) || ((ulong)local_58 >> 0x20 != 0)) {
LAB_00132f1a:
                              plVar20 = mod->ctx;
                              pcVar14 = node->name;
                              LVar19 = LYE_INARG;
                              goto LAB_00132e4e;
                            }
                            goto LAB_001320e3;
                          }
                          goto LAB_00132f02;
                        }
                      }
                      else {
                        iVar4 = strcmp(pcVar14,"value");
                        if (iVar4 == 0) {
                          local_38 = (ushort *)
                                     lys_ext_complex_get_substmt
                                               (LY_STMT_VALUE,(lys_ext_instance_complex *)local_40,
                                                &local_68);
                          if (local_38 == (ushort *)0x0) goto LAB_00132ee9;
                          if ((LY_STMT_CARD_MAND < local_68->cardinality) ||
                             (*(long *)local_38 == 0)) {
                            if (local_68->cardinality < LY_STMT_CARD_SOME) {
                              local_50 = (ushort *)0x0;
                              uVar24 = 0;
                            }
                            else {
                              plVar13 = *(long **)local_38;
                              if (plVar13 == (long *)0x0) {
                                pvVar15 = malloc(0x10);
                                *(void **)local_38 = pvVar15;
                                uVar24 = 0;
                                if (pvVar15 == (void *)0x0) goto LAB_00132ed0;
                              }
                              else {
                                uVar24 = 0xffffffff;
                                do {
                                  uVar24 = (ulong)((int)uVar24 + 1);
                                  lVar26 = *plVar13;
                                  plVar13 = plVar13 + 1;
                                } while (lVar26 != 0);
                              }
                              local_50 = local_38;
                              local_38 = (ushort *)(uVar24 * 8 + *(long *)local_38);
                            }
                            iVar4 = (int)uVar24;
                            pcVar14 = lyxml_get_attr(node,"value",(char *)0x0);
                            if (pcVar14 == (char *)0x0) goto LAB_00132f02;
                            ppuVar8 = __ctype_b_loc();
                            puVar21 = (ushort *)(pcVar14 + -1);
                            do {
                              pcVar14 = (char *)((long)puVar21 + 1);
                              puVar21 = (ushort *)((long)puVar21 + 1);
                            } while ((*(byte *)((long)*ppuVar8 + (long)*pcVar14 * 2 + 1) & 0x20) !=
                                     0);
                            local_58 = (ushort *)strtoll((char *)puVar21,(char **)0x0,10);
                            if ((ushort *)(long)(int)local_58 != local_58) {
                              plVar20 = mod->ctx;
                              pcVar14 = node->name;
                              LVar19 = LYE_INARG;
                              goto LAB_00132e4e;
                            }
                            iVar5 = lyp_yin_parse_subnode_ext
                                              (mod,local_40,LYEXT_PAR_EXTINST,node,
                                               LYEXT_SUBSTMT_VALUE,(uint8_t)uVar24,local_48);
                            if (iVar5 != 0) {
                              return 1;
                            }
                            puVar7 = (undefined4 *)malloc(4);
                            *(undefined4 **)local_38 = puVar7;
                            if (puVar7 == (undefined4 *)0x0) goto LAB_00132ed0;
                            *puVar7 = (int)local_58;
LAB_001322ab:
                            if (local_50 == (ushort *)0x0) goto LAB_00131694;
                            pvVar15 = *(void **)local_50;
                            lVar26 = (long)iVar4;
                            goto LAB_00132146;
                          }
                        }
                        else {
                          iVar4 = strcmp(pcVar14,"position");
                          if (iVar4 != 0) {
                            iVar4 = strcmp(pcVar14,"module");
                            if (iVar4 == 0) {
                              ppvVar12 = yin_getplace_for_extcomplex_struct
                                                   (node,(lys_ext_instance_complex *)local_40,
                                                    LY_STMT_MODULE);
                              if (ppvVar12 == (void **)0x0) {
                                return 1;
                              }
                              plVar11 = yin_read_module_(mod->ctx,node,(char *)0x0,
                                                         *(uint *)&mod->field_0x40 >> 7 & 1);
                              *ppvVar12 = plVar11;
                              goto LAB_00131ffb;
                            }
                            iVar4 = strcmp(pcVar14,"when");
                            if (iVar4 == 0) {
                              puVar21 = (ushort *)
                                        lys_ext_complex_get_substmt
                                                  (LY_STMT_WHEN,(lys_ext_instance_complex *)local_40
                                                   ,&local_68);
                              if (puVar21 != (ushort *)0x0) {
                                if ((LY_STMT_CARD_MAND < local_68->cardinality) ||
                                   (*(long *)puVar21 == 0)) {
                                  if (local_68->cardinality < LY_STMT_CARD_SOME) {
                                    local_38 = (ushort *)0x0;
                                    uVar25 = 0;
                                    puVar23 = puVar21;
                                  }
                                  else {
                                    plVar13 = *(long **)puVar21;
                                    if (plVar13 == (long *)0x0) {
                                      pvVar15 = malloc(0x10);
                                      *(void **)puVar21 = pvVar15;
                                      uVar25 = 0;
                                      if (pvVar15 == (void *)0x0) goto LAB_00132ed0;
                                    }
                                    else {
                                      uVar25 = 0xffffffff;
                                      do {
                                        uVar25 = uVar25 + 1;
                                        lVar26 = *plVar13;
                                        plVar13 = plVar13 + 1;
                                      } while (lVar26 != 0);
                                    }
                                    puVar23 = (ushort *)((ulong)uVar25 * 8 + *(long *)puVar21);
                                    local_38 = puVar21;
                                  }
                                  plVar9 = read_yin_when(mod,node,local_48);
                                  *(lys_when **)puVar23 = plVar9;
                                  if (plVar9 == (lys_when *)0x0) {
                                    return 1;
                                  }
                                  if (local_38 == (ushort *)0x0) goto LAB_00131694;
                                  lVar26 = (long)(int)uVar25;
                                  pvVar15 = realloc(*(void **)local_38,lVar26 * 8 + 0x10);
                                  local_80 = local_38;
                                  goto joined_r0x00132156;
                                }
                                goto LAB_00132f32;
                              }
LAB_00132ee9:
                              plVar20 = mod->ctx;
                              puVar21 = (ushort *)node->name;
                              pcVar14 = node->parent->name;
                              LVar19 = LYE_INCHILDSTMT;
                              goto LAB_00132e4e;
                            }
                            iVar4 = strcmp(pcVar14,"revision");
                            if (iVar4 == 0) {
                              local_38 = (ushort *)
                                         lys_ext_complex_get_substmt
                                                   (LY_STMT_REVISION,
                                                    (lys_ext_instance_complex *)local_40,&local_68);
                              if (local_38 == (ushort *)0x0) goto LAB_00132ee9;
                              if ((local_68->cardinality < LY_STMT_CARD_SOME) &&
                                 (*(long *)local_38 != 0)) goto LAB_00132f32;
                              if (local_68->cardinality < LY_STMT_CARD_SOME) {
                                local_50 = (ushort *)0x0;
                                local_58 = (ushort *)((ulong)local_58._4_4_ << 0x20);
                              }
                              else {
                                plVar13 = *(long **)local_38;
                                if (plVar13 == (long *)0x0) {
                                  pvVar15 = malloc(0x10);
                                  *(void **)local_38 = pvVar15;
                                  local_58 = (ushort *)((ulong)local_58 & 0xffffffff00000000);
                                  if (pvVar15 == (void *)0x0) goto LAB_00132ed0;
                                }
                                else {
                                  local_58 = (ushort *)CONCAT44(local_58._4_4_,0xffffffff);
                                  do {
                                    local_58 = (ushort *)CONCAT44(local_58._4_4_,(int)local_58 + 1);
                                    lVar26 = *plVar13;
                                    plVar13 = plVar13 + 1;
                                  } while (lVar26 != 0);
                                }
                                local_50 = local_38;
                                local_38 = (ushort *)
                                           (((ulong)local_58 & 0xffffffff) * 8 + *(long *)local_38);
                              }
                              rev = (lys_revision *)calloc(1,0x28);
                              *(lys_revision **)local_38 = rev;
                              if (rev != (lys_revision *)0x0) {
                                iVar4 = fill_yin_revision(mod,node,rev,local_48);
                                if (iVar4 != 0) {
                                  return 1;
                                }
                                if (local_50 != (ushort *)0x0) {
                                  if (0 < (int)local_58) {
                                    endptr = (char *)((ulong)local_58 & 0xffffffff);
                                    pcVar14 = (char *)0x0;
                                    do {
                                      iVar4 = strcmp(*(char **)(*(long *)local_50 +
                                                               (long)pcVar14 * 8),*(char **)local_38
                                                    );
                                      if (iVar4 == 0) {
                                        ly_log(mod->ctx,LY_LLWRN,LY_SUCCESS,
                                               "Module\'s revisions are not unique (%s).");
                                      }
                                      pcVar14 = pcVar14 + 1;
                                    } while (endptr != pcVar14);
                                  }
                                  if (local_50 != (ushort *)0x0) {
                                    pvVar15 = *(void **)local_50;
                                    lVar26 = (long)(int)local_58;
                                    goto LAB_00132146;
                                  }
                                }
                                goto LAB_00131694;
                              }
                            }
                            else {
                              iVar4 = strcmp(pcVar14,"unique");
                              if (iVar4 != 0) {
                                iVar4 = strcmp(pcVar14,"action");
                                if (iVar4 == 0) {
                                  pplVar10 = yin_getplace_for_extcomplex_node
                                                       (node,(lys_ext_instance_complex *)local_40,
                                                        LY_STMT_ACTION);
                                  if (pplVar10 == (lys_node **)0x0) {
                                    return 1;
                                  }
                                  plVar11 = (lys_module *)
                                            read_yin_rpc_action(mod,local_40,node,1,local_48);
                                  goto LAB_00131ffb;
                                }
                                iVar4 = strcmp(pcVar14,"anydata");
                                if (iVar4 == 0) {
                                  pplVar10 = yin_getplace_for_extcomplex_node
                                                       (node,(lys_ext_instance_complex *)local_40,
                                                        LY_STMT_ANYDATA);
                                  if (pplVar10 == (lys_node **)0x0) {
                                    return 1;
                                  }
                                  type = LYS_ANYDATA;
LAB_00132656:
                                  plVar11 = (lys_module *)
                                            read_yin_anydata(mod,local_40,node,type,1,local_48);
                                }
                                else {
                                  iVar4 = strcmp(pcVar14,"anyxml");
                                  if (iVar4 == 0) {
                                    pplVar10 = yin_getplace_for_extcomplex_node
                                                         (node,(lys_ext_instance_complex *)local_40,
                                                          LY_STMT_ANYXML);
                                    if (pplVar10 == (lys_node **)0x0) {
                                      return 1;
                                    }
                                    type = LYS_ANYXML;
                                    goto LAB_00132656;
                                  }
                                  iVar4 = strcmp(pcVar14,"case");
                                  if (iVar4 == 0) {
                                    pplVar10 = yin_getplace_for_extcomplex_node
                                                         (node,(lys_ext_instance_complex *)local_40,
                                                          LY_STMT_CASE);
                                    if (pplVar10 == (lys_node **)0x0) {
                                      return 1;
                                    }
                                    plVar11 = (lys_module *)
                                              read_yin_case(mod,local_40,node,1,local_48);
                                  }
                                  else {
                                    iVar4 = strcmp(pcVar14,"choice");
                                    if (iVar4 == 0) {
                                      pplVar10 = yin_getplace_for_extcomplex_node
                                                           (node,(lys_ext_instance_complex *)
                                                                 local_40,LY_STMT_CHOICE);
                                      if (pplVar10 == (lys_node **)0x0) {
                                        return 1;
                                      }
                                      plVar11 = (lys_module *)
                                                read_yin_choice(mod,local_40,node,1,local_48);
                                    }
                                    else {
                                      iVar4 = strcmp(pcVar14,"container");
                                      if (iVar4 == 0) {
                                        pplVar10 = yin_getplace_for_extcomplex_node
                                                             (node,(lys_ext_instance_complex *)
                                                                   local_40,LY_STMT_CONTAINER);
                                        if (pplVar10 == (lys_node **)0x0) {
                                          return 1;
                                        }
                                        plVar11 = (lys_module *)
                                                  read_yin_container(mod,local_40,node,1,local_48);
                                      }
                                      else {
                                        iVar4 = strcmp(pcVar14,"grouping");
                                        if (iVar4 == 0) {
                                          pplVar10 = yin_getplace_for_extcomplex_node
                                                               (node,(lys_ext_instance_complex *)
                                                                     local_40,LY_STMT_GROUPING);
                                          if (pplVar10 == (lys_node **)0x0) {
                                            return 1;
                                          }
                                          plVar11 = (lys_module *)
                                                    read_yin_grouping(mod,local_40,node,1,local_48);
                                        }
                                        else {
                                          iVar4 = strcmp(pcVar14,"output");
                                          if (iVar4 == 0) {
                                            LVar18 = LY_STMT_OUTPUT;
                                          }
                                          else {
                                            iVar4 = strcmp(pcVar14,"input");
                                            if (iVar4 != 0) {
                                              iVar4 = strcmp(pcVar14,"leaf");
                                              if (iVar4 == 0) {
                                                pplVar10 = yin_getplace_for_extcomplex_node
                                                                     (node,(lys_ext_instance_complex
                                                                            *)local_40,LY_STMT_LEAF)
                                                ;
                                                if (pplVar10 == (lys_node **)0x0) {
                                                  return 1;
                                                }
                                                plVar11 = (lys_module *)
                                                          read_yin_leaf(mod,local_40,node,1,local_48
                                                                       );
                                              }
                                              else {
                                                iVar4 = strcmp(pcVar14,"leaf-list");
                                                if (iVar4 == 0) {
                                                  pplVar10 = yin_getplace_for_extcomplex_node
                                                                       (node,(
                                                  lys_ext_instance_complex *)local_40,
                                                  LY_STMT_LEAFLIST);
                                                  if (pplVar10 == (lys_node **)0x0) {
                                                    return 1;
                                                  }
                                                  plVar11 = (lys_module *)
                                                            read_yin_leaflist(mod,local_40,node,1,
                                                                              local_48);
                                                }
                                                else {
                                                  iVar4 = strcmp(pcVar14,"list");
                                                  if (iVar4 == 0) {
                                                    pplVar10 = yin_getplace_for_extcomplex_node
                                                                         (node,(
                                                  lys_ext_instance_complex *)local_40,LY_STMT_LIST);
                                                  if (pplVar10 == (lys_node **)0x0) {
                                                    return 1;
                                                  }
                                                  plVar11 = (lys_module *)
                                                            read_yin_list(mod,local_40,node,1,
                                                                          local_48);
                                                  }
                                                  else {
                                                    iVar4 = strcmp(pcVar14,"notification");
                                                    if (iVar4 == 0) {
                                                      pplVar10 = yin_getplace_for_extcomplex_node
                                                                           (node,(
                                                  lys_ext_instance_complex *)local_40,
                                                  LY_STMT_NOTIFICATION);
                                                  if (pplVar10 == (lys_node **)0x0) {
                                                    return 1;
                                                  }
                                                  plVar11 = (lys_module *)
                                                            read_yin_notif(mod,local_40,node,1,
                                                                           local_48);
                                                  }
                                                  else {
                                                    iVar4 = strcmp(pcVar14,"uses");
                                                    if (iVar4 != 0) {
                                                      iVar4 = strcmp(pcVar14,"length");
                                                      if (iVar4 != 0) {
                                                        iVar4 = strcmp(pcVar14,"must");
                                                        if (iVar4 == 0) {
                                                          ppvVar12 = 
                                                  yin_getplace_for_extcomplex_struct
                                                            (node,(lys_ext_instance_complex *)
                                                                  local_40,LY_STMT_MUST);
                                                  if (ppvVar12 == (void **)0x0) {
                                                    return 1;
                                                  }
                                                  must = (lys_restr *)calloc(1,0x38);
                                                  *ppvVar12 = must;
                                                  if (must == (lys_restr *)0x0) goto LAB_00132e6d;
                                                  iVar4 = fill_yin_must(mod,node,must,local_48);
                                                  goto LAB_00131670;
                                                  }
                                                  iVar4 = strcmp(pcVar14,"pattern");
                                                  if (iVar4 == 0) {
                                                    local_58 = (ushort *)
                                                               lys_ext_complex_get_substmt
                                                                         (LY_STMT_PATTERN,
                                                                          (lys_ext_instance_complex
                                                                           *)local_40,&local_68);
                                                    if (local_58 == (ushort *)0x0)
                                                    goto LAB_00132ee9;
                                                    if ((LY_STMT_CARD_MAND < local_68->cardinality)
                                                       || (*(long *)local_58 == 0)) {
                                                      if (local_68->cardinality < LY_STMT_CARD_SOME)
                                                      {
                                                        local_80 = (ushort *)0x0;
                                                        local_38 = (ushort *)
                                                                   ((ulong)local_38._4_4_ << 0x20);
                                                      }
                                                      else {
                                                        plVar13 = *(long **)local_58;
                                                        if (plVar13 == (long *)0x0) {
                                                          pvVar15 = malloc(0x10);
                                                          *(void **)local_58 = pvVar15;
                                                          local_38 = (ushort *)
                                                                     ((ulong)local_38 &
                                                                     0xffffffff00000000);
                                                          if (pvVar15 == (void *)0x0)
                                                          goto LAB_00132ed0;
                                                        }
                                                        else {
                                                          local_38 = (ushort *)
                                                                     CONCAT44(local_38._4_4_,
                                                                              0xffffffff);
                                                          do {
                                                            local_38 = (ushort *)
                                                                       CONCAT44(local_38._4_4_,
                                                                                (int)local_38 + 1);
                                                            lVar26 = *plVar13;
                                                            plVar13 = plVar13 + 1;
                                                          } while (lVar26 != 0);
                                                        }
                                                        local_80 = local_58;
                                                        local_58 = (ushort *)
                                                                   (((ulong)local_38 & 0xffffffff) *
                                                                    8 + *(long *)local_58);
                                                      }
                                                      endptr = lyxml_get_attr(node,"value",
                                                                              (char *)0x0);
                                                      plVar20 = mod->ctx;
                                                      if (endptr != (char *)0x0) {
                                                        iVar4 = lyp_check_pattern(plVar20,endptr,
                                                                                  (pcre **)0x0);
                                                        if (iVar4 != 0) {
                                                          return 1;
                                                        }
                                                        pvVar15 = calloc(1,0x38);
                                                        *(void **)local_58 = pvVar15;
                                                        if (pvVar15 == (void *)0x0)
                                                        goto LAB_00132e6d;
                                                        info._7_1_ = 6;
                                                        if (((mod->field_0x40 & 0xc) != 0) &&
                                                           (elem = node->child,
                                                           elem != (lyxml_elem *)0x0)) {
                                                          info._7_1_ = 6;
                                                          local_50 = (ushort *)0x0;
                                                          do {
                                                            if (((elem->ns != (lyxml_ns *)0x0) &&
                                                                (iVar4 = strcmp(elem->ns->value,
                                                                                                                                                                
                                                  "urn:ietf:params:xml:ns:yang:yin:1"), iVar4 == 0))
                                                  && (iVar4 = strcmp(elem->name,"modifier"),
                                                     iVar4 == 0)) {
                                                    if (local_50 != (ushort *)0x0) {
                                                      plVar20 = mod->ctx;
                                                      pcVar22 = node->name;
                                                      pcVar14 = "modifier";
                                                      LVar19 = LYE_TOOMANY;
                                                      goto LAB_00132ec7;
                                                    }
                                                    local_50 = (ushort *)
                                                               lyxml_get_attr(elem,"value",
                                                                              (char *)0x0);
                                                    if (local_50 == (ushort *)0x0) {
                                                      plVar20 = mod->ctx;
                                                      pcVar22 = elem->name;
                                                      goto LAB_00132ea2;
                                                    }
                                                    iVar4 = strcmp((char *)local_50,"invert-match");
                                                    if (iVar4 != 0) {
                                                      plVar20 = mod->ctx;
                                                      pcVar22 = "modifier";
                                                      LVar19 = LYE_INARG;
                                                      pcVar14 = (char *)local_50;
                                                      goto LAB_00132ec7;
                                                    }
                                                    iVar4 = lyp_yin_parse_subnode_ext
                                                                      (mod,*(void **)local_58,
                                                                       LYEXT_PAR_RESTR,elem,
                                                                       LYEXT_SUBSTMT_MODIFIER,'\0',
                                                                       local_48);
                                                    info._7_1_ = 0x15;
                                                    if (iVar4 != 0) {
                                                      return 1;
                                                    }
                                                  }
                                                  elem = elem->next;
                                                  } while (elem != (lyxml_elem *)0x0);
                                                  }
                                                  sVar16 = strlen(endptr);
                                                  pvVar15 = malloc(sVar16 + 2);
                                                  puVar21 = local_58;
                                                  **(undefined8 **)local_58 = pvVar15;
                                                  if ((undefined1 *)**(long **)local_58 ==
                                                      (undefined1 *)0x0) goto LAB_00132ed0;
                                                  *(undefined1 *)**(long **)local_58 = info._7_1_;
                                                  strcpy((char *)(**(long **)local_58 + 1),endptr);
                                                  lydict_insert_zc(mod->ctx,(char *)**(undefined8 **
                                                                                      )puVar21);
                                                  iVar4 = read_restr_substmt(mod,*(lys_restr **)
                                                                                  puVar21,node,
                                                                             local_48);
                                                  if (iVar4 != 0) {
                                                    return 1;
                                                  }
                                                  if (local_80 == (ushort *)0x0) goto LAB_00131694;
                                                  lVar26 = (long)(int)local_38;
                                                  pvVar15 = realloc(*(void **)local_80,
                                                                    lVar26 * 8 + 0x10);
                                                  goto joined_r0x00132156;
                                                  }
                                                  goto LAB_00132f05;
                                                  }
                                                  }
                                                  else {
                                                    iVar4 = strcmp(pcVar14,"range");
                                                    if (iVar4 != 0) {
                                                      plVar20 = mod->ctx;
                                                      pLVar6 = ly_errno_glob_address();
                                                      ly_log(plVar20,LY_LLERR,*pLVar6,
                                                                                                                          
                                                  "Extension\'s substatement \"%s\" not supported.")
                                                  ;
                                                  goto LAB_00131694;
                                                  }
                                                  local_38 = (ushort *)
                                                             lys_ext_complex_get_substmt
                                                                       (LY_STMT_RANGE,
                                                                        (lys_ext_instance_complex *)
                                                                        local_40,&local_68);
                                                  if (local_38 == (ushort *)0x0) goto LAB_00132ee9;
                                                  if ((LY_STMT_CARD_MAND < local_68->cardinality) ||
                                                     (*(long *)local_38 == 0)) {
                                                    if (local_68->cardinality < LY_STMT_CARD_SOME)
                                                    goto LAB_00132b31;
                                                    plVar13 = *(long **)local_38;
                                                    if (plVar13 == (long *)0x0) goto LAB_00132b3e;
                                                    uVar24 = 0xffffffff;
                                                    do {
                                                      uVar24 = (ulong)((int)uVar24 + 1);
                                                      lVar26 = *plVar13;
                                                      plVar13 = plVar13 + 1;
                                                    } while (lVar26 != 0);
                                                    goto LAB_00132b5b;
                                                  }
                                                  }
                                                  goto LAB_00132f32;
                                                  }
                                                  local_38 = (ushort *)
                                                             lys_ext_complex_get_substmt
                                                                       (LY_STMT_LENGTH,
                                                                        (lys_ext_instance_complex *)
                                                                        local_40,&local_68);
                                                  if (local_38 != (ushort *)0x0) {
                                                    if ((LY_STMT_CARD_MAND < local_68->cardinality)
                                                       || (*(long *)local_38 == 0)) {
                                                      if (local_68->cardinality < LY_STMT_CARD_SOME)
                                                      {
LAB_00132b31:
                                                        local_50 = (ushort *)0x0;
                                                        uVar24 = 0;
                                                      }
                                                      else {
                                                        plVar13 = *(long **)local_38;
                                                        if (plVar13 == (long *)0x0) {
LAB_00132b3e:
                                                          pvVar15 = malloc(0x10);
                                                          *(void **)local_38 = pvVar15;
                                                          uVar24 = 0;
                                                          if (pvVar15 == (void *)0x0)
                                                          goto LAB_00132ed0;
                                                        }
                                                        else {
                                                          uVar24 = 0xffffffff;
                                                          do {
                                                            uVar24 = (ulong)((int)uVar24 + 1);
                                                            lVar26 = *plVar13;
                                                            plVar13 = plVar13 + 1;
                                                          } while (lVar26 != 0);
                                                        }
LAB_00132b5b:
                                                        local_50 = local_38;
                                                        local_38 = (ushort *)
                                                                   (uVar24 * 8 + *(long *)local_38);
                                                      }
                                                      iVar4 = (int)uVar24;
                                                      pcVar14 = lyxml_get_attr(node,"value",
                                                                               (char *)0x0);
                                                      if (pcVar14 != (char *)0x0) {
                                                        pvVar15 = calloc(1,0x38);
                                                        *(void **)local_38 = pvVar15;
                                                        plVar20 = mod->ctx;
                                                        if (pvVar15 == (void *)0x0)
                                                        goto LAB_00132e7e;
                                                        pcVar14 = lydict_insert(plVar20,pcVar14,0);
                                                        **(undefined8 **)local_38 = pcVar14;
                                                        iVar5 = read_restr_substmt(mod,*(lys_restr *
                                                  *)local_38,node,local_48);
                                                  if (iVar5 != 0) {
                                                    return 1;
                                                  }
                                                  goto LAB_001322ab;
                                                  }
                                                  goto LAB_00132f02;
                                                  }
                                                  goto LAB_00132f32;
                                                  }
                                                  goto LAB_00132ee9;
                                                  }
                                                  pplVar10 = yin_getplace_for_extcomplex_node
                                                                       (node,(
                                                  lys_ext_instance_complex *)local_40,LY_STMT_USES);
                                                  if (pplVar10 == (lys_node **)0x0) {
                                                    return 1;
                                                  }
                                                  plVar11 = (lys_module *)
                                                            read_yin_uses(mod,local_40,node,1,
                                                                          local_48);
                                                  }
                                                  }
                                                }
                                              }
                                              goto LAB_00131ffb;
                                            }
                                            LVar18 = LY_STMT_INPUT;
                                          }
                                          pplVar10 = yin_getplace_for_extcomplex_node
                                                               (node,(lys_ext_instance_complex *)
                                                                     local_40,LVar18);
                                          if (pplVar10 == (lys_node **)0x0) {
                                            return 1;
                                          }
                                          plVar11 = (lys_module *)
                                                    read_yin_input_output
                                                              (mod,local_40,node,1,local_48);
                                        }
                                      }
                                    }
                                  }
                                }
LAB_00131ffb:
                                if (plVar11 == (lys_module *)0x0) {
                                  return 1;
                                }
                                goto LAB_00131694;
                              }
                              puVar21 = (ushort *)
                                        lys_ext_complex_get_substmt
                                                  (LY_STMT_UNIQUE,
                                                   (lys_ext_instance_complex *)local_40,&local_68);
                              if (puVar21 == (ushort *)0x0) goto LAB_00132ee9;
                              if ((local_68->cardinality < LY_STMT_CARD_SOME) &&
                                 (*(long *)puVar21 != 0)) goto LAB_00132f32;
                              if (local_68->cardinality < LY_STMT_CARD_SOME) {
                                local_38 = (ushort *)0x0;
                                uVar25 = 0;
                                puVar23 = puVar21;
                              }
                              else {
                                plVar13 = *(long **)puVar21;
                                if (plVar13 == (long *)0x0) {
                                  pvVar15 = malloc(0x10);
                                  *(void **)puVar21 = pvVar15;
                                  uVar25 = 0;
                                  if (pvVar15 == (void *)0x0) goto LAB_00132ed0;
                                }
                                else {
                                  uVar25 = 0xffffffff;
                                  do {
                                    uVar25 = uVar25 + 1;
                                    lVar26 = *plVar13;
                                    plVar13 = plVar13 + 1;
                                  } while (lVar26 != 0);
                                }
                                puVar23 = (ushort *)((ulong)uVar25 * 8 + *(long *)puVar21);
                                local_38 = puVar21;
                              }
                              unique = (lys_unique *)calloc(1,0x10);
                              *(lys_unique **)puVar23 = unique;
                              if (unique != (lys_unique *)0x0) {
                                iVar4 = fill_yin_unique(mod,local_40,node,unique,local_48);
                                if (iVar4 != 0) {
                                  return 1;
                                }
                                iVar4 = lyp_yin_parse_subnode_ext
                                                  (mod,local_40,LYEXT_PAR_EXTINST,node,
                                                   LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar25,local_48);
                                if (iVar4 != 0) {
                                  return 1;
                                }
                                if (local_38 == (ushort *)0x0) goto LAB_00131694;
                                lVar26 = (long)(int)uVar25;
                                pvVar15 = realloc(*(void **)local_38,lVar26 * 8 + 0x10);
                                local_80 = local_38;
                                if (pvVar15 == (void *)0x0) goto LAB_00132e6d;
                                goto LAB_00132160;
                              }
                            }
LAB_00132ed0:
                            plVar20 = mod->ctx;
LAB_00132e7e:
                            ly_log(plVar20,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                                   "lyp_yin_parse_complex_ext");
                            return 1;
                          }
                          local_38 = (ushort *)
                                     lys_ext_complex_get_substmt
                                               (LY_STMT_POSITION,
                                                (lys_ext_instance_complex *)local_40,&local_68);
                          if (local_38 == (ushort *)0x0) goto LAB_00132ee9;
                          if ((LY_STMT_CARD_MAND < local_68->cardinality) ||
                             (*(long *)local_38 == 0)) {
                            if (local_68->cardinality < LY_STMT_CARD_SOME) {
                              local_50 = (ushort *)0x0;
                              uVar25 = 0;
                            }
                            else {
                              plVar13 = *(long **)local_38;
                              if (plVar13 == (long *)0x0) {
                                pvVar15 = malloc(0x10);
                                *(void **)local_38 = pvVar15;
                                uVar25 = 0;
                                if (pvVar15 == (void *)0x0) goto LAB_00132ed0;
                              }
                              else {
                                uVar25 = 0xffffffff;
                                do {
                                  uVar25 = uVar25 + 1;
                                  lVar26 = *plVar13;
                                  plVar13 = plVar13 + 1;
                                } while (lVar26 != 0);
                              }
                              local_50 = local_38;
                              local_38 = (ushort *)((ulong)uVar25 * 8 + *(long *)local_38);
                            }
                            puVar21 = (ushort *)lyxml_get_attr(node,"value",(char *)0x0);
                            if (puVar21 == (ushort *)0x0) goto LAB_00132f02;
                            local_58 = (ushort *)strtoll((char *)puVar21,(char **)0x0,10);
                            if ((ulong)local_58 >> 0x20 != 0) goto LAB_00132f1a;
                            type_00 = LYEXT_SUBSTMT_POSITION;
                            goto LAB_00132104;
                          }
                        }
                      }
                    }
                  }
LAB_00132f32:
                  plVar20 = mod->ctx;
                  yin = node->parent;
                  puVar21 = (ushort *)node->name;
                  goto LAB_00132e41;
                }
                LVar18 = LY_STMT_MODIFIER;
                pcVar14 = "invert-match";
                pcVar22 = (char *)0x0;
              }
              iVar4 = yin_parse_extcomplex_bool
                                (mod,node,(lys_ext_instance_complex *)local_40,LVar18,pcVar14,
                                 pcVar22,local_48);
              goto LAB_0013112d;
            }
            LVar18 = LY_STMT_ORGANIZATION;
          }
          goto LAB_0013165e;
        }
        LVar18 = LY_STMT_ARGUMENT;
        iVar4 = 0;
        pcVar14 = "name";
        goto LAB_0013166b;
      }
      ppvVar12 = yin_getplace_for_extcomplex_struct
                           (node,(lys_ext_instance_complex *)ext_00,LY_STMT_TYPEDEF);
      if (ppvVar12 == (void **)0x0) {
        return 1;
      }
      tpdf = (lys_tpdf *)calloc(1,0x80);
      *ppvVar12 = tpdf;
      if (tpdf == (lys_tpdf *)0x0) {
LAB_00132e6d:
        plVar20 = mod->ctx;
        goto LAB_00132e7e;
      }
      iVar4 = fill_yin_typedef(mod,local_40,node,tpdf,local_48);
      goto LAB_00131670;
    }
    ppvVar12 = yin_getplace_for_extcomplex_struct
                         (node,(lys_ext_instance_complex *)ext_00,LY_STMT_TYPE);
    if (ppvVar12 == (void **)0x0) {
      return 1;
    }
    pvVar15 = calloc(1,0x40);
    *ppvVar12 = pvVar15;
    plVar20 = mod->ctx;
    if (pvVar15 == (void *)0x0) goto LAB_00132e7e;
    lyxml_unlink(plVar20,node);
    *(lyxml_elem **)((long)*ppvVar12 + 0x10) = node;
    *(lys_node **)((long)*ppvVar12 + 0x18) = local_40;
    iVar4 = unres_schema_add_node(mod,local_48,*ppvVar12,UNRES_TYPE_DER_EXT,(lys_node *)0x0);
    node = plVar2;
    if (iVar4 == -1) {
      *(undefined8 *)((long)*ppvVar12 + 0x10) = 0;
      return 1;
    }
  } while( true );
}

Assistant:

int
lyp_yin_parse_complex_ext(struct lys_module *mod, struct lys_ext_instance_complex *ext, struct lyxml_elem *yin,
                          struct unres_schema *unres)
{
    struct lyxml_elem *next, *node, *child;
    struct lys_type **type;
    void **pp, *p, *reallocated;
    const char *value, *name;
    char *endptr, modifier;
    struct lyext_substmt *info;
    long int v;
    long long int ll;
    unsigned long u;
    int i, j;

#define YIN_STORE_VALUE(TYPE, FROM, TO)           \
    *(TYPE **)TO = malloc(sizeof(TYPE));          \
    if (!*(TYPE **)TO) { LOGMEM(mod->ctx); goto error; }    \
    (**(TYPE **)TO) = (TYPE)FROM;

#define YIN_EXTCOMPLEX_GETPLACE(STMT, TYPE)                                          \
    p = lys_ext_complex_get_substmt(STMT, ext, &info);                               \
    if (!p) {                                                                        \
        LOGVAL(mod->ctx, LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, node->name, node->parent->name); \
        goto error;                                                                  \
    }                                                                                \
    if (info->cardinality < LY_STMT_CARD_SOME && (*(TYPE*)p)) {                      \
        LOGVAL(mod->ctx, LYE_TOOMANY, LY_VLOG_NONE, NULL, node->name, node->parent->name);     \
        goto error;                                                                  \
    }                                                                                \
    pp = NULL; i = 0;                                                                \
    if (info->cardinality >= LY_STMT_CARD_SOME) {                                    \
        /* there can be multiple instances */                                        \
        pp = p;                                                                      \
        if (!(*pp)) {                                                                \
            *pp = malloc(2 * sizeof(TYPE)); /* allocate initial array */             \
            LY_CHECK_ERR_GOTO(!*pp, LOGMEM(mod->ctx), error);                        \
        } else {                                                                     \
            for (i = 0; (*(TYPE**)pp)[i]; i++);                                      \
        }                                                                            \
        p = &(*(TYPE**)pp)[i];                                                       \
    }